

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeRecordCompareString(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  int local_40;
  int szHdr;
  int nStr;
  int nCmp;
  int res;
  int serial_type;
  u8 *aKey1;
  UnpackedRecord *pPKey2_local;
  void *pKey1_local;
  int nKey1_local;
  
  nCmp = (int)*(char *)((long)pKey1 + 1);
  _res = (byte *)pKey1;
  aKey1 = (u8 *)pPKey2;
  pPKey2_local = (UnpackedRecord *)pKey1;
  pKey1_local._0_4_ = nKey1;
  while (nCmp < 0xc) {
    if ((-1 < nCmp) || (sqlite3GetVarint32(_res + 1,(u32 *)&nCmp), nCmp < 0xc)) {
      return (int)(char)aKey1[0x20];
    }
  }
  if ((nCmp & 1U) == 0) {
    return (int)(char)aKey1[0x21];
  }
  iVar2 = (nCmp + -0xc) / 2;
  if ((int)pKey1_local < (int)((uint)*_res + iVar2)) {
    iVar2 = sqlite3CorruptError(0x1531b);
    aKey1[0x1f] = (u8)iVar2;
    return 0;
  }
  local_40 = iVar2;
  if (*(int *)(aKey1 + 0x18) < iVar2) {
    local_40 = *(int *)(aKey1 + 0x18);
  }
  iVar3 = memcmp(_res + (int)(uint)*_res,*(void **)(aKey1 + 0x10),(long)local_40);
  if (0 < iVar3) {
    return (int)(char)aKey1[0x21];
  }
  if (iVar3 < 0) {
    return (int)(char)aKey1[0x20];
  }
  if (iVar2 == *(int *)(aKey1 + 0x18)) {
    if (1 < *(ushort *)(aKey1 + 0x1c)) {
      iVar2 = sqlite3VdbeRecordCompareWithSkip
                        ((int)pKey1_local,pPKey2_local,(UnpackedRecord *)aKey1,1);
      return iVar2;
    }
    aKey1[0x22] = '\x01';
    return (int)(char)aKey1[0x1e];
  }
  if (iVar2 - *(int *)(aKey1 + 0x18) < 1) {
    uVar1 = aKey1[0x20];
  }
  else {
    uVar1 = aKey1[0x21];
  }
  nStr = (int)(char)uVar1;
  return nStr;
}

Assistant:

static int vdbeRecordCompareString(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey1 = (const u8*)pKey1;
  int serial_type;
  int res;

  assert( pPKey2->aMem[0].flags & MEM_Str );
  assert( pPKey2->aMem[0].n == pPKey2->n );
  assert( pPKey2->aMem[0].z == pPKey2->u.z );
  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  serial_type = (signed char)(aKey1[1]);

vrcs_restart:
  if( serial_type<12 ){
    if( serial_type<0 ){
      sqlite3GetVarint32(&aKey1[1], (u32*)&serial_type);
      if( serial_type>=12 ) goto vrcs_restart;
      assert( CORRUPT_DB );
    }
    res = pPKey2->r1;      /* (pKey1/nKey1) is a number or a null */
  }else if( !(serial_type & 0x01) ){
    res = pPKey2->r2;      /* (pKey1/nKey1) is a blob */
  }else{
    int nCmp;
    int nStr;
    int szHdr = aKey1[0];

    nStr = (serial_type-12) / 2;
    if( (szHdr + nStr) > nKey1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;    /* Corruption */
    }
    nCmp = MIN( pPKey2->n, nStr );
    res = memcmp(&aKey1[szHdr], pPKey2->u.z, nCmp);

    if( res>0 ){
      res = pPKey2->r2;
    }else if( res<0 ){
      res = pPKey2->r1;
    }else{
      res = nStr - pPKey2->n;
      if( res==0 ){
        if( pPKey2->nField>1 ){
          res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
        }else{
          res = pPKey2->default_rc;
          pPKey2->eqSeen = 1;
        }
      }else if( res>0 ){
        res = pPKey2->r2;
      }else{
        res = pPKey2->r1;
      }
    }
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res)
       || CORRUPT_DB
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  return res;
}